

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O2

void update_KKT_P(csc *KKT,csc *P,c_int *PtoKKT,c_float param1,c_int *Pdiag_idx,c_int Pdiag_n)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  lVar1 = P->p[P->n];
  if (P->p[P->n] < 1) {
    lVar1 = lVar2;
  }
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    KKT->x[PtoKKT[lVar2]] = P->x[lVar2];
  }
  lVar1 = 0;
  if (Pdiag_n < 1) {
    Pdiag_n = lVar1;
  }
  for (; Pdiag_n != lVar1; lVar1 = lVar1 + 1) {
    KKT->x[PtoKKT[Pdiag_idx[lVar1]]] = KKT->x[PtoKKT[Pdiag_idx[lVar1]]] + param1;
  }
  return;
}

Assistant:

void update_KKT_P(csc          *KKT,
                  const csc    *P,
                  const c_int  *PtoKKT,
                  const c_float param1,
                  const c_int  *Pdiag_idx,
                  const c_int   Pdiag_n) {
  c_int i, j; // Iterations

  // Update elements of KKT using P
  for (i = 0; i < P->p[P->n]; i++) {
    KKT->x[PtoKKT[i]] = P->x[i];
  }

  // Update diagonal elements of KKT by adding sigma
  for (i = 0; i < Pdiag_n; i++) {
    j                  = Pdiag_idx[i]; // Extract index of the element on the
                                       // diagonal
    KKT->x[PtoKKT[j]] += param1;
  }
}